

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::FunctionalTest::getPixels
          (FunctionalTest *this,GLuint name,targetDesc *desc,GLuint level,GLubyte *out_pixels)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  GLubyte *out_pixels_local;
  GLuint level_local;
  targetDesc *desc_local;
  GLuint name_local;
  FunctionalTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0xb8))(desc->m_target,name);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xc85);
  (**(code **)(lVar4 + 0xaa0))(desc->m_target,level,desc->m_format,desc->m_type,out_pixels);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xc88);
  (**(code **)(lVar4 + 0xb8))(desc->m_target,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xc8b);
  return;
}

Assistant:

void FunctionalTest::getPixels(GLuint name, const targetDesc& desc, GLuint level, GLubyte* out_pixels) const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindTexture(desc.m_target, name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	gl.getTexImage(desc.m_target, level, desc.m_format, desc.m_type, out_pixels);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");

	gl.bindTexture(desc.m_target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
}